

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O1

void __thiscall
pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
          (PltFileManager *this,int a_lev,Geometry *a_level_geom,int pltComp,int dataComp,int nComp,
          MultiFab *a_mf)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  PltFileManager *pPVar4;
  Geometry *fgeom;
  bool bVar5;
  int *piVar6;
  Periodicity *pPVar7;
  long lVar8;
  ulong uVar9;
  pointer pGVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  initializer_list<amrex::MultiFab_*> __l;
  initializer_list<double> __l_00;
  initializer_list<amrex::MultiFab_*> __l_01;
  initializer_list<double> __l_02;
  initializer_list<amrex::MultiFab_*> __l_03;
  initializer_list<double> __l_04;
  allocator_type local_442;
  allocator_type local_441;
  PltFileManager *local_440;
  ulong local_438;
  vector<double,_std::allocator<double>_> local_430;
  IntVect local_418;
  long local_408;
  long local_400;
  IntVect local_3f8;
  MultiFab *local_3e8;
  vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_3e0;
  IntVect local_3d8;
  Geometry *local_3c8;
  long local_3c0;
  double local_3b8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> dummyBCRec;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> local_388;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> local_298;
  MultiFab temp;
  
  local_440 = this;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,(long)nComp,
             (allocator_type *)&temp);
  piVar6 = (dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start)->bc + 3;
  lVar12 = 0;
  do {
    if (*(char *)((long)(a_level_geom->super_CoordSys).inv_dx + lVar12 + 0x19) == '\0') {
      if (0 < nComp) {
        lVar13 = 0;
        do {
          *(undefined4 *)((long)piVar6 + lVar13 + -0xc) = 2;
          *(undefined4 *)((long)piVar6 + lVar13) = 2;
          lVar13 = lVar13 + 0x18;
        } while ((ulong)(uint)nComp * 0x18 != lVar13);
      }
    }
    else if (0 < nComp) {
      lVar13 = 0;
      do {
        *(undefined4 *)((long)piVar6 + lVar13 + -0xc) = 0;
        *(undefined4 *)((long)piVar6 + lVar13) = 0;
        lVar13 = lVar13 + 0x18;
      } while ((ulong)(uint)nComp * 0x18 != lVar13);
    }
    lVar12 = lVar12 + 1;
    piVar6 = piVar6 + 1;
  } while (lVar12 != 3);
  local_438 = (ulong)(uint)nComp;
  local_3c8 = a_level_geom;
  if (a_lev == 0) {
    bVar5 = amrex::RealBox::contains
                      (&((local_440->m_geoms).
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         _M_impl.super__Vector_impl_data._M_start)->prob_domain,
                       &a_level_geom->prob_domain,1e-07);
    if (!bVar5) {
      amrex::Assert_host("m_geoms[0].ProbDomain().contains(a_level_geom.ProbDomain(), 0.0000001)",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/PelePhysics/Utility/PltFileManager/PltFileManager.cpp"
                         ,0xd3,(char *)0x0);
    }
    pGVar10 = (local_440->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar1 = (long)(((a_level_geom->domain).bigend.vect[0] - (a_level_geom->domain).smallend.vect[0])
                  + 1) /
            (long)(((pGVar10->domain).bigend.vect[0] - (pGVar10->domain).smallend.vect[0]) + 1);
    lVar12 = (long)(((a_level_geom->domain).bigend.vect[1] - (a_level_geom->domain).smallend.vect[1]
                    ) + 1) /
             (long)((*(int *)((long)&(pGVar10->domain).bigend + 4) -
                    *(int *)((long)&(pGVar10->domain).smallend + 4)) + 1);
    local_3d8.vect[2] =
         (((a_level_geom->domain).bigend.vect[2] - (a_level_geom->domain).smallend.vect[2]) + 1) /
         ((*(int *)((long)&(pGVar10->domain).bigend + 8) -
          *(int *)((long)&(pGVar10->domain).smallend + 8)) + 1);
    uVar9 = lVar12 << 0x20 | uVar1 & 0xffffffff;
    iVar11 = (int)uVar1;
    local_3d8.vect[1] = (int)lVar12;
    local_3d8.vect._0_8_ = uVar9;
    if (((iVar11 == 1) && (local_3d8.vect[1] == 1)) && (local_3d8.vect[2] == 1)) {
      memcpy((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *
             )&temp,a_level_geom,200);
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                 (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2),
                 &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      local_418.vect._0_8_ =
           (local_440->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
           super__Vector_impl_data._M_start;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_418;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_298,__l_01,
                 (allocator_type *)&local_3e8);
      local_3f8.vect[0] = 0;
      local_3f8.vect[1] = 0;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&local_3f8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_388,__l_02,
                 (allocator_type *)&local_3b8);
      amrex::
      FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                (a_mf,(IntVect *)&local_430,0.0,
                 (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_298,
                 (Vector<double,_std::allocator<double>_> *)&local_388,pltComp,dataComp,nComp,
                 a_level_geom,
                 (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                  *)&temp,0);
      if ((_func_int **)local_388.m_geom.super_CoordSys._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_388.m_geom.super_CoordSys._0_8_,
                        (long)local_388.m_geom.super_CoordSys.offset[1] -
                        local_388.m_geom.super_CoordSys._0_8_);
      }
      if ((pointer)local_298.m_geom.super_CoordSys._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_298.m_geom.super_CoordSys._0_8_,
                        (long)local_298.m_geom.super_CoordSys.offset[1] -
                        local_298.m_geom.super_CoordSys._0_8_);
      }
      if (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_ != 0) {
        operator_delete((void *)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_,
                        (long)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.m_bdkey.
                              m_dm_id.data -
                        temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_);
      }
    }
    else {
      if (local_3d8.vect[1] < iVar11) {
        local_3d8.vect[1] = iVar11;
      }
      if (local_3d8.vect[1] <= local_3d8.vect[2]) {
        local_3d8.vect[1] = local_3d8.vect[2];
      }
      if (local_3d8.vect[1] < 2) {
        amrex::Abort_host(
                         "When initializing dataFromPlt, our level 0 can\'t be coarser than the PltFile one"
                         );
      }
      else {
        memcpy(&temp,pGVar10,200);
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2),
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
        memcpy(&local_298,a_level_geom,200);
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  (&local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
        local_388.m_geom.super_CoordSys._0_8_ = (_func_int **)0x0;
        local_388.m_geom.super_CoordSys.offset[0] =
             (Real)((ulong)local_388.m_geom.super_CoordSys.offset[0]._4_4_ << 0x20);
        amrex::
        InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                  (a_mf,(IntVect *)&local_388,0.0,
                   (local_440->m_data).
                   super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                   super__Vector_impl_data._M_start,pltComp,dataComp,nComp,
                   (local_440->m_geoms).
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_start,a_level_geom,
                   (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                    *)&temp,0,&local_298,0,&local_3d8,(InterpBase *)amrex::mf_cell_cons_interp,
                   (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
                   (NullInterpHook<amrex::FArrayBox> *)&local_430,
                   (NullInterpHook<amrex::FArrayBox> *)&local_418);
        if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_298.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_ != 0) {
          operator_delete((void *)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_,
                          (long)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.m_bdkey.
                                m_dm_id.data -
                          temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_);
        }
        pGVar10 = (local_440->m_geoms).
                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (200 < (long)(local_440->m_geoms).
                        super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pGVar10) {
          lVar14 = 200;
          local_3e0 = &local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>;
          lVar12 = 1;
          local_408 = 0x180;
          local_400 = 0x10;
          lVar13 = 0x68;
          do {
            pPVar4 = local_440;
            uVar1 = (long)(((local_3c8->domain).bigend.vect[0] -
                           (local_3c8->domain).smallend.vect[0]) + 1) /
                    (long)((*(int *)((long)&(pGVar10->domain).bigend + lVar14) -
                           *(int *)((long)&(pGVar10->domain).smallend + lVar14)) + 1);
            lVar8 = (long)(((local_3c8->domain).bigend.vect[1] -
                           (local_3c8->domain).smallend.vect[1]) + 1) /
                    (long)((*(int *)((long)&(pGVar10->domain).bigend + lVar14 + 4U) -
                           *(int *)((long)&(pGVar10->domain).smallend + lVar14 + 4U)) + 1);
            local_3f8.vect[2] =
                 (((local_3c8->domain).bigend.vect[2] - (local_3c8->domain).smallend.vect[2]) + 1) /
                 ((*(int *)((long)&(pGVar10->domain).bigend + lVar14 + 8U) -
                  *(int *)((long)&(pGVar10->domain).smallend + lVar14 + 8U)) + 1);
            uVar9 = lVar8 << 0x20 | uVar1 & 0xffffffff;
            local_3f8.vect[1] = (int)lVar8;
            bVar5 = local_3f8.vect[2] == 1;
            bVar2 = local_3f8.vect[1] == 1;
            bVar3 = (int)uVar1 == 1;
            local_3f8.vect._0_8_ = uVar9;
            local_3c0 = lVar12;
            if (bVar5 && (bVar2 && bVar3)) {
              local_298.m_geom.super_CoordSys._0_8_ = (pointer)0x1;
              local_298.m_geom.super_CoordSys.offset[2] = 0.0;
              local_298.m_geom.super_CoordSys.dx[0] = 0.0;
              local_298.m_geom.super_CoordSys.offset[0] = 0.0;
              local_298.m_geom.super_CoordSys.offset[1] = 0.0;
              local_388.m_geom.super_CoordSys._0_8_ = &PTR__FabFactory_008378d0;
              amrex::MultiFab::MultiFab
                        (&temp,(BoxArray *)
                               ((long)&(((local_440->m_grids).
                                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         .
                                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_bat).
                                       m_bat_type + lVar13),
                         (DistributionMapping *)
                         ((long)&(((local_440->m_dmaps).
                                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   .
                                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         + local_400),(int)local_438,0,(MFInfo *)&local_298,
                         (FabFactory<amrex::FArrayBox> *)&local_388);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_298.m_geom.super_CoordSys.offset + 1));
              memcpy(&local_298,
                     (void *)((long)(((pPVar4->m_geoms).
                                      super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                      .
                                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                    offset + lVar14 + 0xfffffffffffffff8U),200);
              std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                        (local_3e0,
                         &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
              local_418.vect._0_8_ = (pointer)0x0;
              local_418.vect[2] = 0;
              local_3e8 = (MultiFab *)
                          ((long)&(((pPVar4->m_data).
                                    super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                    super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_408);
              __l_03._M_len = 1;
              __l_03._M_array = &local_3e8;
              std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                        ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_388
                         ,__l_03,&local_441);
              local_3b8 = 0.0;
              __l_04._M_len = 1;
              __l_04._M_array = &local_3b8;
              std::vector<double,_std::allocator<double>_>::vector(&local_430,__l_04,&local_442);
              amrex::
              FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                        ((MultiFab *)&temp.super_FabArray<amrex::FArrayBox>,&local_418,0.0,
                         (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_388
                         ,(Vector<double,_std::allocator<double>_> *)&local_430,pltComp,0,
                         (int)local_438,
                         (Geometry *)
                         ((long)(((local_440->m_geoms).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + lVar14 + 0xfffffffffffffff8U),&local_298,0);
              if (local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_430.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_430.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_430.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if ((_func_int **)local_388.m_geom.super_CoordSys._0_8_ != (_func_int **)0x0) {
                operator_delete((void *)local_388.m_geom.super_CoordSys._0_8_,
                                (long)local_388.m_geom.super_CoordSys.offset[1] -
                                local_388.m_geom.super_CoordSys._0_8_);
              }
              pPVar7 = amrex::Periodicity::NonPeriodic();
              local_388.m_geom.super_CoordSys._0_8_ = (_func_int **)0x0;
              local_388.m_geom.super_CoordSys.offset[0] =
                   (Real)((ulong)local_388.m_geom.super_CoordSys.offset[0] & 0xffffffff00000000);
              local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                        (&a_mf->super_FabArray<amrex::FArrayBox>,
                         &temp.super_FabArray<amrex::FArrayBox>,0,dataComp,(int)local_438,
                         (IntVect *)&local_388,(IntVect *)&local_430,pPVar7,COPY,(CPC *)0x0,false);
              if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_298.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_298.m_bcr.
                                      super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_298.m_bcr.
                                      super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              amrex::refine((BoxArray *)&local_298,
                            (BoxArray *)
                            ((long)&(((local_440->m_grids).
                                      super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                      .
                                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type
                            + lVar13),&local_3f8);
              local_388.m_geom.super_CoordSys._0_8_ = (_func_int **)0x1;
              local_388.m_geom.super_CoordSys.offset[2] = 0.0;
              local_388.m_geom.super_CoordSys.dx[0] = 0.0;
              local_388.m_geom.super_CoordSys.offset[0] = 0.0;
              local_388.m_geom.super_CoordSys.offset[1] = 0.0;
              local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&PTR__FabFactory_008378d0;
              amrex::MultiFab::MultiFab
                        (&temp,(BoxArray *)&local_298,
                         (DistributionMapping *)
                         ((long)&(((pPVar4->m_dmaps).
                                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   .
                                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         + local_400),(int)local_438,0,(MFInfo *)&local_388,
                         (FabFactory<amrex::FArrayBox> *)&local_430);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_388.m_geom.super_CoordSys.offset + 1));
              amrex::BoxArray::~BoxArray((BoxArray *)&local_298);
              memcpy(&local_298,
                     (void *)((long)(((pPVar4->m_geoms).
                                      super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                      .
                                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                    offset + lVar14 + 0xfffffffffffffff8U),200);
              std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                        (local_3e0,
                         &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
              fgeom = local_3c8;
              memcpy(&local_388,local_3c8,200);
              std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                        (&local_388.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                         &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
              local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              iVar11 = (int)local_438;
              amrex::
              InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                        (&temp,(IntVect *)&local_430,0.0,
                         (MultiFab *)
                         ((long)&(((local_440->m_data).
                                   super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_408),
                         pltComp,0,iVar11,
                         (Geometry *)
                         ((long)(((local_440->m_geoms).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + lVar14 + 0xfffffffffffffff8U),fgeom,&local_298,0,&local_388,0,&local_3f8,
                         (InterpBase *)amrex::mf_cell_cons_interp,&dummyBCRec,0,
                         (NullInterpHook<amrex::FArrayBox> *)&local_418,
                         (NullInterpHook<amrex::FArrayBox> *)&local_3e8);
              pPVar7 = amrex::Periodicity::NonPeriodic();
              local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              local_418.vect._0_8_ = (pointer)0x0;
              local_418.vect[2] = 0;
              amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                        (&a_mf->super_FabArray<amrex::FArrayBox>,
                         &temp.super_FabArray<amrex::FArrayBox>,0,dataComp,iVar11,
                         (IntVect *)&local_430,&local_418,pPVar7,COPY,(CPC *)0x0,false);
              if (local_388.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_388.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_388.m_bcr.
                                      super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_388.m_bcr.
                                      super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_298.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_298.m_bcr.
                                      super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_298.m_bcr.
                                      super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            amrex::MultiFab::~MultiFab(&temp);
            if (bVar5 && (bVar2 && bVar3)) break;
            lVar12 = local_3c0 + 1;
            pGVar10 = (local_440->m_geoms).
                      super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar8 = ((long)(local_440->m_geoms).
                           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pGVar10 >> 3) *
                    -0x70a3d70a3d70a3d7;
            lVar14 = lVar14 + 200;
            local_408 = local_408 + 0x180;
            local_400 = local_400 + 0x10;
            lVar13 = lVar13 + 0x68;
          } while (lVar8 - lVar12 != 0 && lVar12 <= lVar8);
        }
      }
    }
  }
  else {
    pGVar10 = (local_440->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_3d8.vect[2] =
         (((a_level_geom->domain).bigend.vect[2] - (a_level_geom->domain).smallend.vect[2]) + 1) /
         ((*(int *)((long)&(pGVar10->domain).bigend + 8) -
          *(int *)((long)&(pGVar10->domain).smallend + 8)) + 1);
    local_3d8.vect._0_8_ =
         (long)(((a_level_geom->domain).bigend.vect[1] - (a_level_geom->domain).smallend.vect[1]) +
               1) /
         (long)((*(int *)((long)&(pGVar10->domain).bigend + 4) -
                *(int *)((long)&(pGVar10->domain).smallend + 4)) + 1) << 0x20 |
         (long)(((a_level_geom->domain).bigend.vect[0] - (a_level_geom->domain).smallend.vect[0]) +
               1) /
         (long)(((pGVar10->domain).bigend.vect[0] - (pGVar10->domain).smallend.vect[0]) + 1) &
         0xffffffffU;
    memcpy(&temp,pGVar10,200);
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2),
               &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
    memcpy(&local_298,a_level_geom,200);
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              (&local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
               &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
    local_388.m_geom.super_CoordSys._0_8_ = (_func_int **)0x0;
    local_388.m_geom.super_CoordSys.offset[0] =
         (Real)((ulong)local_388.m_geom.super_CoordSys.offset[0]._4_4_ << 0x20);
    amrex::
    InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
              (a_mf,(IntVect *)&local_388,0.0,
               (local_440->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start,pltComp,dataComp,nComp,
               (local_440->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start,a_level_geom,
               (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                *)&temp,0,&local_298,0,&local_3d8,(InterpBase *)amrex::mf_cell_cons_interp,
               (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
               (NullInterpHook<amrex::FArrayBox> *)&local_430,
               (NullInterpHook<amrex::FArrayBox> *)&local_418);
    if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_298.m_bcr.
                            super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.m_bcr.
                            super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_ != 0) {
      operator_delete((void *)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_,
                      (long)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.m_bdkey.m_dm_id
                            .data - temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_
                     );
    }
    pGVar10 = (local_440->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (200 < (long)(local_440->m_geoms).
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pGVar10) {
      lVar14 = 200;
      local_3e0 = &local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>;
      lVar12 = 1;
      local_408 = 0x180;
      local_400 = 0x10;
      lVar13 = 0x68;
      do {
        pPVar4 = local_440;
        uVar1 = (long)(((a_level_geom->domain).bigend.vect[0] -
                       (a_level_geom->domain).smallend.vect[0]) + 1) /
                (long)((*(int *)((long)&(pGVar10->domain).bigend + lVar14) -
                       *(int *)((long)&(pGVar10->domain).smallend + lVar14)) + 1);
        lVar8 = (long)(((a_level_geom->domain).bigend.vect[1] -
                       (a_level_geom->domain).smallend.vect[1]) + 1) /
                (long)((*(int *)((long)&(pGVar10->domain).bigend + lVar14 + 4U) -
                       *(int *)((long)&(pGVar10->domain).smallend + lVar14 + 4U)) + 1);
        local_3f8.vect[2] =
             (((a_level_geom->domain).bigend.vect[2] - (a_level_geom->domain).smallend.vect[2]) + 1)
             / ((*(int *)((long)&(pGVar10->domain).bigend + lVar14 + 8U) -
                *(int *)((long)&(pGVar10->domain).smallend + lVar14 + 8U)) + 1);
        uVar9 = lVar8 << 0x20 | uVar1 & 0xffffffff;
        local_3f8.vect[1] = (int)lVar8;
        bVar5 = local_3f8.vect[2] == 1;
        bVar2 = local_3f8.vect[1] == 1;
        bVar3 = (int)uVar1 == 1;
        local_3f8.vect._0_8_ = uVar9;
        local_3c0 = lVar12;
        if (bVar5 && (bVar2 && bVar3)) {
          local_298.m_geom.super_CoordSys._0_8_ = (pointer)0x1;
          local_298.m_geom.super_CoordSys.offset[2] = 0.0;
          local_298.m_geom.super_CoordSys.dx[0] = 0.0;
          local_298.m_geom.super_CoordSys.offset[0] = 0.0;
          local_298.m_geom.super_CoordSys.offset[1] = 0.0;
          local_388.m_geom.super_CoordSys._0_8_ = &PTR__FabFactory_008378d0;
          amrex::MultiFab::MultiFab
                    (&temp,(BoxArray *)
                           ((long)&(((local_440->m_grids).
                                     super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     .
                                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                           lVar13),
                     (DistributionMapping *)
                     ((long)&(((local_440->m_dmaps).
                               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               .
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                     + local_400),(int)local_438,0,(MFInfo *)&local_298,
                     (FabFactory<amrex::FArrayBox> *)&local_388);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_298.m_geom.super_CoordSys.offset + 1));
          memcpy(&local_298,
                 (void *)((long)(((pPVar4->m_geoms).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + lVar14 + 0xfffffffffffffff8U),200);
          std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                    (local_3e0,&dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                    );
          local_418.vect._0_8_ = (pointer)0x0;
          local_418.vect[2] = 0;
          local_3e8 = (MultiFab *)
                      ((long)&(((pPVar4->m_data).
                                super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_408);
          __l._M_len = 1;
          __l._M_array = &local_3e8;
          std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                    ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_388,__l
                     ,&local_441);
          local_3b8 = 0.0;
          __l_00._M_len = 1;
          __l_00._M_array = &local_3b8;
          std::vector<double,_std::allocator<double>_>::vector(&local_430,__l_00,&local_442);
          amrex::
          FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                    (&temp,&local_418,0.0,
                     (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_388,
                     (Vector<double,_std::allocator<double>_> *)&local_430,pltComp,0,(int)local_438,
                     (Geometry *)
                     ((long)(((local_440->m_geoms).
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                     lVar14 + 0xfffffffffffffff8U),&local_298,0);
          lVar12 = local_3c0;
          if (local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_430.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_430.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((_func_int **)local_388.m_geom.super_CoordSys._0_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_388.m_geom.super_CoordSys._0_8_,
                            (long)local_388.m_geom.super_CoordSys.offset[1] -
                            local_388.m_geom.super_CoordSys._0_8_);
          }
          pPVar7 = amrex::Periodicity::NonPeriodic();
          local_388.m_geom.super_CoordSys._0_8_ = (_func_int **)0x0;
          local_388.m_geom.super_CoordSys.offset[0] =
               (Real)((ulong)local_388.m_geom.super_CoordSys.offset[0] & 0xffffffff00000000);
          local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                    (&a_mf->super_FabArray<amrex::FArrayBox>,&temp.super_FabArray<amrex::FArrayBox>,
                     0,dataComp,(int)local_438,(IntVect *)&local_388,(IntVect *)&local_430,pPVar7,
                     COPY,(CPC *)0x0,false);
          a_level_geom = local_3c8;
          if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_298.m_bcr.
                            super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_298.m_bcr.
                                  super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_298.m_bcr.
                                  super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          amrex::refine((BoxArray *)&local_298,
                        (BoxArray *)
                        ((long)&(((local_440->m_grids).
                                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                        lVar13),&local_3f8);
          local_388.m_geom.super_CoordSys._0_8_ = (_func_int **)0x1;
          local_388.m_geom.super_CoordSys.offset[2] = 0.0;
          local_388.m_geom.super_CoordSys.dx[0] = 0.0;
          local_388.m_geom.super_CoordSys.offset[0] = 0.0;
          local_388.m_geom.super_CoordSys.offset[1] = 0.0;
          local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__FabFactory_008378d0;
          amrex::MultiFab::MultiFab
                    (&temp,(BoxArray *)&local_298,
                     (DistributionMapping *)
                     ((long)&(((pPVar4->m_dmaps).
                               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               .
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                     + local_400),(int)local_438,0,(MFInfo *)&local_388,
                     (FabFactory<amrex::FArrayBox> *)&local_430);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_388.m_geom.super_CoordSys.offset + 1));
          amrex::BoxArray::~BoxArray((BoxArray *)&local_298);
          memcpy(&local_298,
                 (void *)((long)(((pPVar4->m_geoms).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + lVar14 + 0xfffffffffffffff8U),200);
          std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                    (local_3e0,&dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                    );
          memcpy(&local_388,a_level_geom,200);
          std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                    (&local_388.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                     &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
          local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          iVar11 = (int)local_438;
          amrex::
          InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                    ((MultiFab *)&temp.super_FabArray<amrex::FArrayBox>,(IntVect *)&local_430,0.0,
                     (MultiFab *)
                     ((long)&(((local_440->m_data).
                               super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_408),
                     pltComp,0,iVar11,
                     (Geometry *)
                     ((long)(((local_440->m_geoms).
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                     lVar14 + 0xfffffffffffffff8U),a_level_geom,&local_298,0,&local_388,0,&local_3f8
                     ,(InterpBase *)amrex::mf_cell_cons_interp,
                     (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                     &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
                     (NullInterpHook<amrex::FArrayBox> *)&local_418,
                     (NullInterpHook<amrex::FArrayBox> *)&local_3e8);
          pPVar7 = amrex::Periodicity::NonPeriodic();
          local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_430.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          local_418.vect._0_8_ = (pointer)0x0;
          local_418.vect[2] = 0;
          amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                    (&a_mf->super_FabArray<amrex::FArrayBox>,&temp.super_FabArray<amrex::FArrayBox>,
                     0,dataComp,iVar11,(IntVect *)&local_430,&local_418,pPVar7,COPY,(CPC *)0x0,false
                    );
          lVar12 = local_3c0;
          a_level_geom = local_3c8;
          if (local_388.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_388.m_bcr.
                            super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_388.m_bcr.
                                  super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_388.m_bcr.
                                  super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_298.m_bcr.
                            super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_298.m_bcr.
                                  super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_298.m_bcr.
                                  super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        amrex::MultiFab::~MultiFab(&temp);
        if (bVar5 && (bVar2 && bVar3)) break;
        lVar12 = lVar12 + 1;
        pGVar10 = (local_440->m_geoms).
                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar8 = ((long)(local_440->m_geoms).
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pGVar10 >> 3) *
                -0x70a3d70a3d70a3d7;
        lVar14 = lVar14 + 200;
        local_408 = local_408 + 0x180;
        local_400 = local_400 + 0x10;
        lVar13 = lVar13 + 0x68;
      } while (lVar8 - lVar12 != 0 && lVar12 <= lVar8);
    }
  }
  if (dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
PltFileManager::fillPatchFromPlt(
  int a_lev,
  const Geometry& a_level_geom,
  int pltComp,
  int dataComp,
  int nComp,
  MultiFab& a_mf)
{
  Vector<BCRec> dummyBCRec(nComp);
  for (int idim = 0; idim < AMREX_SPACEDIM; idim++) {
    if (a_level_geom.isPeriodic(idim)) {
      for (int n = 0; n < nComp; n++) {
        dummyBCRec[n].setLo(idim, BCType::int_dir);
        dummyBCRec[n].setHi(idim, BCType::int_dir);
      }
    } else {
      for (int n = 0; n < nComp; n++) {
        dummyBCRec[n].setLo(idim, BCType::foextrap);
        dummyBCRec[n].setHi(idim, BCType::foextrap);
      }
    }
  }

  // There might be a number of problems related to proper nesting of the
  // current BA and the PltFile BA. Try to address some of those, but need
  // further testing.

  if (a_lev == 0) {
    // Ensure that the provided level 0 geometry is contained in the one
    // we've read from the pltfile
    AMREX_ALWAYS_ASSERT(
      m_geoms[0].ProbDomain().contains(a_level_geom.ProbDomain(), 0.0000001));

    // Check the refRatio between PltFile level 0 and ours
    IntVect lev0rr = a_level_geom.Domain().size() / m_geoms[0].Domain().size();

    // Same domain size, just do a fill patch single level
    if (lev0rr == IntVect::TheUnitVector()) {
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      FillPatchSingleLevel(
        a_mf, IntVect(0), 0.0, {&(m_data[a_lev])}, {0.0}, pltComp, dataComp,
        nComp, a_level_geom, bndry_func, 0);

      // Our level 0 is finer than the PltFile one.
    } else if (lev0rr.max() > 1) {

      // Interpolator (need EB version ?)
      InterpBase* mapper = &mf_cell_cons_interp;

      // Start by filling all the data with a coarseInterp. We've checked that
      // the geom RealBoxes match already, so PltFile level 0 is good to interp.
      {
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
          m_geoms[0], {dummyBCRec}, FillExtDirDummy{});
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
          a_level_geom, {dummyBCRec}, FillExtDirDummy{});
        InterpFromCoarseLevel(
          a_mf, IntVect(0), 0.0, m_data[0], pltComp, dataComp, nComp,
          m_geoms[0], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
          lev0rr, mapper, {dummyBCRec}, 0);
      }

      // Then get data from the PltFile finer levels if any
      for (int pltlev = 1; pltlev < m_geoms.size(); pltlev++) {

        IntVect rr =
          a_level_geom.Domain().size() / m_geoms[pltlev].Domain().size();

        // Current Plt level resolution matches our: lets interp and wrap it up
        if (rr == IntVect::TheUnitVector()) {
          MultiFab temp(m_grids[pltlev], m_dmaps[pltlev], nComp, 0);
          PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
            m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
          FillPatchSingleLevel(
            temp, IntVect(0), 0.0, {&m_data[pltlev]}, {0.0}, pltComp, 0, nComp,
            m_geoms[pltlev], bndry_func, 0);

          a_mf.ParallelCopy(temp, 0, dataComp, nComp);

          break;
        }

        // Otherwise do another InterpFromCoarseLevel
        MultiFab temp(refine(m_grids[pltlev], rr), m_dmaps[pltlev], nComp, 0);
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
          m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
          a_level_geom, {dummyBCRec}, FillExtDirDummy{});
        InterpFromCoarseLevel(
          temp, IntVect(0), 0.0, m_data[pltlev], pltComp, 0, nComp,
          m_geoms[pltlev], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
          rr, mapper, {dummyBCRec}, 0);
        a_mf.ParallelCopy(temp, 0, dataComp, nComp);
      }

    } else {
      // Otherwise bail out because we don't handle averaging_down (TODO ?)
      Abort("When initializing dataFromPlt, our level 0 can't be coarser than "
            "the PltFile one");
    }
  } else {
    // Check the refRatio between PltFile level 0 and the current level
    IntVect lev0rr = a_level_geom.Domain().size() / m_geoms[0].Domain().size();

    // Interpolator (need EB version ?)
    InterpBase* mapper = &mf_cell_cons_interp;

    // Start by filling the entire level with level 0 from PltFile, to ensure we
    // have some data everywhere
    {
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
        m_geoms[0], {dummyBCRec}, FillExtDirDummy{});
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      InterpFromCoarseLevel(
        a_mf, IntVect(0), 0.0, m_data[0], pltComp, dataComp, nComp, m_geoms[0],
        a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0, lev0rr, mapper,
        {dummyBCRec}, 0);
    }

    // Then get data from the PltFile finer levels if any
    for (int pltlev = 1; pltlev < m_geoms.size(); pltlev++) {

      IntVect rr =
        a_level_geom.Domain().size() / m_geoms[pltlev].Domain().size();

      // Current Plt level resolution matches our: lets interp and wrap it up
      if (rr == IntVect::TheUnitVector()) {
        MultiFab temp(m_grids[pltlev], m_dmaps[pltlev], nComp, 0);
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
          m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
        FillPatchSingleLevel(
          temp, IntVect(0), 0.0, {&m_data[pltlev]}, {0.0}, pltComp, 0, nComp,
          m_geoms[pltlev], bndry_func, 0);

        a_mf.ParallelCopy(temp, 0, dataComp, nComp);

        break;
      }

      // Otherwise do another InterpFromCoarseLevel
      MultiFab temp(refine(m_grids[pltlev], rr), m_dmaps[pltlev], nComp, 0);
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
        m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      InterpFromCoarseLevel(
        temp, IntVect(0), 0.0, m_data[pltlev], pltComp, 0, nComp,
        m_geoms[pltlev], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
        rr, mapper, {dummyBCRec}, 0);
      a_mf.ParallelCopy(temp, 0, dataComp, nComp);
    }
  }
}